

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

void __thiscall
flow::CondBrInstr::CondBrInstr
          (CondBrInstr *this,Value *cond,BasicBlock *trueBlock,BasicBlock *falseBlock)

{
  initializer_list<flow::Value_*> __l;
  allocator<flow::Value_*> local_69;
  Value *local_68;
  BasicBlock *local_60;
  BasicBlock *local_58;
  iterator local_50;
  size_type local_48;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_40;
  BasicBlock *local_28;
  BasicBlock *falseBlock_local;
  BasicBlock *trueBlock_local;
  Value *cond_local;
  CondBrInstr *this_local;
  
  local_50 = &local_68;
  local_48 = 3;
  local_68 = cond;
  local_60 = trueBlock;
  local_58 = falseBlock;
  local_28 = falseBlock;
  falseBlock_local = trueBlock;
  trueBlock_local = (BasicBlock *)cond;
  cond_local = (Value *)this;
  std::allocator<flow::Value_*>::allocator(&local_69);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector(&local_40,__l,&local_69);
  TerminateInstr::TerminateInstr(&this->super_TerminateInstr,&local_40);
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::~vector(&local_40);
  std::allocator<flow::Value_*>::~allocator(&local_69);
  (this->super_TerminateInstr).super_Instr.super_Value._vptr_Value =
       (_func_int **)&PTR__CondBrInstr_002d32c8;
  return;
}

Assistant:

CondBrInstr::CondBrInstr(Value* cond, BasicBlock* trueBlock, BasicBlock* falseBlock)
    : TerminateInstr({cond, trueBlock, falseBlock}) {}